

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Card.hpp
# Opt level: O0

void __thiscall Card::~Card(Card *this)

{
  Card *this_local;
  
  ~Card(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

virtual bool ChainHoldings(list<Card*>, Card*) { return false; }